

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

pair<HighsImplications::VarBound_*,_bool> __thiscall
HighsHashTree<int,_HighsImplications::VarBound>::InnerLeaf<3>::insert_entry
          (InnerLeaf<3> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  double dVar1;
  undefined4 uVar2;
  uint8_t pos_00;
  bool bVar3;
  uint16_t chunks;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  HighsHashTableEntry<int,_HighsImplications::VarBound> *in_RCX;
  int in_EDX;
  uint64_t in_RSI;
  InnerLeaf<3> *in_RDI;
  pair<HighsImplications::VarBound_*,_bool> pVar7;
  int pos;
  uint8_t hashChunk;
  uint16_t hash;
  undefined7 in_stack_ffffffffffffff58;
  uint8_t in_stack_ffffffffffffff5f;
  array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_38UL> *in_stack_ffffffffffffff60;
  uint16_t *in_stack_ffffffffffffff68;
  int *in_stack_ffffffffffffff70;
  InnerLeaf<3> *in_stack_ffffffffffffff78;
  int local_38;
  VarBound *local_10;
  undefined1 local_8;
  
  chunks = get_hash_chunks16(in_RSI,in_EDX);
  pos_00 = get_first_chunk16(chunks);
  local_38 = Occupation::num_set_until
                       ((Occupation *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5f);
  bVar3 = Occupation::test(&in_RDI->occupation,pos_00);
  if (bVar3) {
    local_38 = local_38 + -1;
    while (pvVar4 = std::array<unsigned_long,_39UL>::operator[]
                              ((array<unsigned_long,_39UL> *)in_stack_ffffffffffffff60,
                               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)),
          (ulong)chunks < *pvVar4) {
      local_38 = local_38 + 1;
    }
    HighsHashTableEntry<int,_HighsImplications::VarBound>::key(in_RCX);
    bVar3 = find_key(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     (int *)in_stack_ffffffffffffff60);
    if (bVar3) {
      pvVar5 = std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_38UL>::operator[]
                         (in_stack_ffffffffffffff60,
                          CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      HighsHashTableEntry<int,_HighsImplications::VarBound>::value(pvVar5);
      pVar7 = std::make_pair<HighsImplications::VarBound*,bool>
                        ((VarBound **)in_stack_ffffffffffffff60,
                         (bool *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      local_8 = pVar7.second;
      goto LAB_005fcdcc;
    }
  }
  else {
    Occupation::set(&in_RDI->occupation,pos_00);
    if (local_38 < in_RDI->size) {
      while (pvVar4 = std::array<unsigned_long,_39UL>::operator[]
                                ((array<unsigned_long,_39UL> *)in_stack_ffffffffffffff60,
                                 CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)),
            (ulong)chunks < *pvVar4) {
        local_38 = local_38 + 1;
      }
    }
  }
  if (local_38 < in_RDI->size) {
    move_backward(in_RDI,(int *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  }
  pvVar5 = std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_38UL>::operator[]
                     ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_38UL> *)in_RCX,
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  (pvVar5->value_).constant = (in_RCX->value_).constant;
  uVar2 = *(undefined4 *)&in_RCX->field_0x4;
  dVar1 = (in_RCX->value_).coef;
  pvVar5->key_ = in_RCX->key_;
  *(undefined4 *)&pvVar5->field_0x4 = uVar2;
  (pvVar5->value_).coef = dVar1;
  uVar6 = (ulong)chunks;
  pvVar4 = std::array<unsigned_long,_39UL>::operator[]
                     ((array<unsigned_long,_39UL> *)in_RCX,
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  *pvVar4 = uVar6;
  in_RDI->size = in_RDI->size + 1;
  pvVar4 = std::array<unsigned_long,_39UL>::operator[]
                     ((array<unsigned_long,_39UL> *)in_RCX,
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  *pvVar4 = 0;
  pvVar5 = std::array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_38UL>::operator[]
                     ((array<HighsHashTableEntry<int,_HighsImplications::VarBound>,_38UL> *)in_RCX,
                      CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  HighsHashTableEntry<int,_HighsImplications::VarBound>::value(pvVar5);
  pVar7 = std::make_pair<HighsImplications::VarBound*,bool>
                    ((VarBound **)in_RCX,
                     (bool *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  local_8 = pVar7.second;
LAB_005fcdcc:
  local_10 = pVar7.first;
  pVar7.second = (bool)local_8;
  pVar7.first = local_10;
  return pVar7;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }